

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::showChildren(QWidgetPrivate *this,bool spontaneous)

{
  uint *puVar1;
  uint uVar2;
  QArrayData *pQVar3;
  long lVar4;
  long lVar5;
  QWidgetPrivate *this_00;
  QWExtra *pQVar6;
  QWidgetData *pQVar7;
  QDebug QVar8;
  _Head_base<0UL,_QTLWExtra_*,_false> _Var9;
  char *pcVar10;
  long lVar11;
  QWidget *pQVar12;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  undefined1 local_a0 [8];
  QDebug local_98;
  anon_unknown_dwarf_294700 local_90 [8];
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 local_74;
  char *local_70;
  QDebug local_68;
  undefined1 local_60 [8];
  QDebug local_58;
  WidgetAttributes local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivateLogging::lcWidgetShowHide();
  if (((byte)QtPrivateLogging::lcWidgetShowHide::category.field_2.bools.enabledDebug._q_value.
             _M_base._M_i & 1) != 0) {
    local_88 = 2;
    uStack_84 = 0;
    uStack_80 = 0;
    uStack_7c = 0;
    uStack_78 = 0;
    local_74 = 0;
    local_70 = QtPrivateLogging::lcWidgetShowHide::category.name;
    QMessageLogger::debug();
    QVar8.stream = local_68.stream;
    QVar13.m_data = (storage_type *)0x13;
    QVar13.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<((QTextStream *)QVar8.stream,(QString *)local_50);
    if (local_50[0].widget != (QWidget *)0x0) {
      LOCK();
      *(int *)local_50[0].widget = *(int *)local_50[0].widget + -1;
      UNLOCK();
      if (*(int *)local_50[0].widget == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].widget,2,0x10);
      }
    }
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    local_60 = (undefined1  [8])local_68.stream;
    *(int *)(local_68.stream + 0x28) = *(int *)(local_68.stream + 0x28) + 1;
    ::operator<<((Stream *)&local_58,(QWidget *)local_60);
    QVar8.stream = local_58.stream;
    QVar14.m_data = (storage_type *)0xd;
    QVar14.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<((QTextStream *)QVar8.stream,(QString *)local_50);
    if (local_50[0].widget != (QWidget *)0x0) {
      LOCK();
      *(int *)local_50[0].widget = *(int *)local_50[0].widget + -1;
      UNLOCK();
      if (*(int *)local_50[0].widget == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].widget,2,0x10);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    pcVar10 = "false";
    if (spontaneous) {
      pcVar10 = "true";
    }
    QTextStream::operator<<((QTextStream *)local_58.stream,pcVar10);
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QDebug::~QDebug(&local_58);
    QDebug::~QDebug((QDebug *)local_60);
    QDebug::~QDebug(&local_68);
  }
  pQVar3 = *(QArrayData **)&this->field_0x18;
  lVar4 = *(long *)&this->field_0x20;
  lVar5 = *(long *)&this->field_0x28;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (lVar5 != 0) {
    lVar11 = 0;
    do {
      pQVar12 = *(QWidget **)(lVar4 + lVar11 * 8);
      if ((pQVar12 == (QWidget *)0x0) || ((*(byte *)(*(long *)&pQVar12->field_0x8 + 0x30) & 1) == 0)
         ) {
        pQVar12 = (QWidget *)0x0;
      }
      if (pQVar12 != (QWidget *)0x0) {
        QtPrivateLogging::lcWidgetShowHide();
        if (((byte)QtPrivateLogging::lcWidgetShowHide::category.field_2.bools.enabledDebug._q_value.
                   _M_base._M_i & 1) != 0) {
          local_88 = 2;
          uStack_84 = 0;
          uStack_80 = 0;
          uStack_7c = 0;
          uStack_78 = 0;
          local_74 = 0;
          local_70 = QtPrivateLogging::lcWidgetShowHide::category.name;
          QMessageLogger::debug();
          QVar8.stream = local_68.stream;
          QVar15.m_data = &DAT_0000000b;
          QVar15.m_size = (qsizetype)local_50;
          QString::fromUtf8(QVar15);
          QTextStream::operator<<((QTextStream *)QVar8.stream,(QString *)local_50);
          if (local_50[0].widget != (QWidget *)0x0) {
            LOCK();
            *(int *)local_50[0].widget = *(int *)local_50[0].widget + -1;
            UNLOCK();
            if (*(int *)local_50[0].widget == 0) {
              QArrayData::deallocate((QArrayData *)local_50[0].widget,2,0x10);
            }
          }
          if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_68.stream,' ');
          }
          local_a0 = (undefined1  [8])local_68.stream;
          *(int *)(local_68.stream + 0x28) = *(int *)(local_68.stream + 0x28) + 1;
          ::operator<<((Stream *)&local_58,(QWidget *)local_a0);
          QVar8.stream = local_58.stream;
          QVar16.m_data = (storage_type *)0xf;
          QVar16.m_size = (qsizetype)local_50;
          QString::fromUtf8(QVar16);
          QTextStream::operator<<((QTextStream *)QVar8.stream,(QString *)local_50);
          if (local_50[0].widget != (QWidget *)0x0) {
            LOCK();
            *(int *)local_50[0].widget = *(int *)local_50[0].widget + -1;
            UNLOCK();
            if (*(int *)local_50[0].widget == 0) {
              QArrayData::deallocate((QArrayData *)local_50[0].widget,2,0x10);
            }
          }
          if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_58.stream,' ');
          }
          local_98.stream = local_58.stream;
          *(int *)(local_58.stream + 0x28) = *(int *)(local_58.stream + 0x28) + 1;
          local_50[0].widget = pQVar12;
          anon_unknown.dwarf_294700::operator<<(local_90,&local_98,local_50);
          QDebug::~QDebug((QDebug *)local_90);
          QDebug::~QDebug(&local_98);
          QDebug::~QDebug(&local_58);
          QDebug::~QDebug((QDebug *)local_a0);
          QDebug::~QDebug(&local_68);
        }
        this_00 = *(QWidgetPrivate **)&pQVar12->field_0x8;
        pQVar6 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>
                 ._M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                 super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
        if (pQVar6 == (QWExtra *)0x0) {
          _Var9._M_head_impl = (QTLWExtra *)0x0;
        }
        else {
          _Var9._M_head_impl =
               *(QTLWExtra **)
                &(pQVar6->topextra)._M_t.
                 super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
        }
        if ((((_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>)_Var9._M_head_impl !=
              (QTLWExtra *)0x0) && (*(long *)((long)_Var9._M_head_impl + 0x20) != 0)) &&
           ((this_00->high_attributes[1] & 0x20) == 0)) {
          uVar2 = pQVar12->data->widget_attributes;
          if ((uVar2 >> 0x10 & 1) != 0) {
            pQVar12->data->widget_attributes = uVar2 & 0xfffeffff;
          }
        }
        pQVar7 = pQVar12->data;
        if (((pQVar7->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
          uVar2 = pQVar7->widget_attributes;
          if ((uVar2 >> 0x10 & 1) == 0) {
            if (spontaneous) {
              if ((uVar2 >> 0xb & 1) == 0) {
                pQVar7->widget_attributes = uVar2 | 0x800;
              }
              showChildren(this_00,true);
              local_88 = 0xaaaaaaaa;
              uStack_84 = 0xaaaaaaaa;
              uStack_80 = 0xaaaaaaaa;
              uStack_7c = 0xaaaaaaaa;
              QShowEvent::QShowEvent((QShowEvent *)&local_88);
              QCoreApplication::sendSpontaneousEvent(&pQVar12->super_QObject,(QEvent *)&local_88);
              QShowEvent::~QShowEvent((QShowEvent *)&local_88);
            }
            else if ((this_00->high_attributes[1] & 0x20) == 0) {
              this_00->field_0x253 = this_00->field_0x253 | 0x80;
              (**(code **)(*(long *)pQVar12 + 0x68))(pQVar12,1);
              puVar1 = (uint *)(*(long *)&pQVar12->field_0x8 + 0x250);
              *puVar1 = *puVar1 & 0x7fffffff;
            }
            else {
              show_recursive(this_00);
            }
          }
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar5 != lVar11);
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::showChildren(bool spontaneous)
{
    Q_Q(QWidget);
    qCDebug(lcWidgetShowHide) << "Showing children of" << q
                              << "spontaneously" << spontaneous;

    QList<QObject*> childList = children;
    for (int i = 0; i < childList.size(); ++i) {
        QWidget *widget = qobject_cast<QWidget*>(childList.at(i));
        if (!widget)
            continue;
        qCDebug(lcWidgetShowHide) << "Considering" << widget
              << "with attributes" << WidgetAttributes{widget};
        if (widget->windowHandle() && !widget->testAttribute(Qt::WA_WState_ExplicitShowHide))
            widget->setAttribute(Qt::WA_WState_Hidden, false);
        if (widget->isWindow() || widget->testAttribute(Qt::WA_WState_Hidden))
            continue;
        if (spontaneous) {
            widget->setAttribute(Qt::WA_Mapped);
            widget->d_func()->showChildren(true);
            QShowEvent e;
            QApplication::sendSpontaneousEvent(widget, &e);
        } else {
            if (widget->testAttribute(Qt::WA_WState_ExplicitShowHide)) {
                widget->d_func()->show_recursive();
            } else {
                // Call QWidget::setVisible() here, so that subclasses
                // that (wrongly) override setVisible to do initialization
                // will still be notified that they are made visible, but
                // do so without triggering ExplicitShowHide.
                widget->d_func()->dontSetExplicitShowHide = true;
                widget->setVisible(true);
                widget->d_func()->dontSetExplicitShowHide = false;
            }
        }
    }
}